

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout_p.h
# Opt level: O2

QList<int> * __thiscall
QMainWindowLayoutSeparatorHelper<QMainWindowLayout>::findSeparator
          (QList<int> *__return_storage_ptr__,
          QMainWindowLayoutSeparatorHelper<QMainWindowLayout> *this,QPoint *pos)

{
  qsizetype qVar1;
  bool bVar2;
  QWidget *this_00;
  QWidget *object;
  QWidget *toolBar;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QToolBarAreaLayout::isEmpty((QToolBarAreaLayout *)&this[1].hoverPos);
  if (!bVar2) {
    this_00 = QLayout::parentWidget((QLayout *)&this[-1].movingSeparator.d.size);
    object = QWidget::childAt(this_00,pos);
    for (; (object != (QWidget *)0x0 && (object != this_00));
        object = *(QWidget **)(*(long *)&object->field_0x8 + 0x10)) {
      toolBar = &QtPrivate::qobject_cast_helper<QToolBar*,QObject>(&object->super_QObject)->
                 super_QWidget;
      if (toolBar != (QWidget *)0x0) {
        QToolBarAreaLayout::indexOf
                  ((QList<int> *)&local_50,(QToolBarAreaLayout *)&this[1].hoverPos,toolBar);
        qVar1 = local_50.size;
        QArrayDataPointer<int>::~QArrayDataPointer(&local_50);
        if (qVar1 != 0) {
          (__return_storage_ptr__->d).d = (Data *)0x0;
          (__return_storage_ptr__->d).ptr = (int *)0x0;
          (__return_storage_ptr__->d).size = 0;
          goto LAB_003fde3a;
        }
      }
    }
  }
  QDockAreaLayout::findSeparator
            (__return_storage_ptr__,(QDockAreaLayout *)&this[3].movingSeparator.d.size,pos);
LAB_003fde3a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<int> QMainWindowLayoutSeparatorHelper<Layout>::findSeparator(const QPoint &pos) const
{
    Layout *layout = const_cast<Layout*>(this->layout());
#if QT_CONFIG(toolbar)
    QToolBarAreaLayout *toolBarAreaLayout = layout->toolBarAreaLayout();
    if (toolBarAreaLayout && !toolBarAreaLayout->isEmpty()) {
        // We might have a toolbar that is currently expanded, covering
        // parts of the dock area, in which case we don't want the dock
        // area layout to treat mouse events for the expanded toolbar as
        // hitting a separator.
        const QWidget *widget = layout->window();
        QWidget *childWidget = widget->childAt(pos);
        while (childWidget && childWidget != widget) {
            if (auto *toolBar = qobject_cast<QToolBar*>(childWidget)) {
                if (!toolBarAreaLayout->indexOf(toolBar).isEmpty())
                    return {};
            }
            childWidget = childWidget->parentWidget();
        }
    }
#endif
    return layout->dockAreaLayoutInfo()->findSeparator(pos);
}